

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uart61.cpp
# Opt level: O2

int IMU_JY61::uart_set(int fd,int nSpeed,int nBits,char nEvent,int nStop)

{
  speed_t *__termios_p;
  int iVar1;
  uint uVar2;
  ulong uVar3;
  speed_t __speed;
  undefined1 local_ac [8];
  termios oldtio;
  
  iVar1 = tcgetattr(fd,(termios *)local_ac);
  if (iVar1 != 0) {
    perror("SetupSerial 1");
    uVar2 = tcgetattr(fd,(termios *)local_ac);
    printf("tcgetattr( fd,&oldtio) -> %d\n",(ulong)uVar2);
    return -1;
  }
  __termios_p = &oldtio.c_ispeed;
  bzero(__termios_p,0x3c);
  uVar3 = (ulong)((int)nEvent - 0x45U);
  if ((int)nEvent - 0x45U < 0x2b) {
    if ((0x100000001U >> (uVar3 & 0x3f) & 1) == 0) {
      if (((0x20000000200U >> (uVar3 & 0x3f) & 1) == 0) &&
         ((0x40000000400U >> (uVar3 & 0x3f) & 1) != 0)) {
        oldtio.c_ispeed._0_1_ = (byte)oldtio.c_ispeed | 0x30;
      }
    }
    else {
      oldtio.c_ispeed._0_1_ = (byte)oldtio.c_ispeed | 0x30;
    }
  }
  if (nSpeed == 0x960) {
    __speed = 0xb;
  }
  else if (nSpeed == 0x70800) {
    __speed = 0x1004;
  }
  else {
    if (nSpeed != 0x2580) {
      if (nSpeed == 0x1c200) {
        __speed = 0x1002;
        goto LAB_0010391d;
      }
      if (nSpeed == 0x12c0) {
        __speed = 0xc;
        goto LAB_0010391d;
      }
    }
    __speed = 0xd;
  }
LAB_0010391d:
  cfsetispeed((termios *)__termios_p,__speed);
  cfsetospeed((termios *)__termios_p,__speed);
  tcflush(fd,0);
  iVar1 = tcsetattr(fd,0,(termios *)&oldtio.c_ispeed);
  if (iVar1 != 0) {
    perror("com set error");
    return -1;
  }
  puts("set done!");
  return 0;
}

Assistant:

int uart_set(int fd,int nSpeed, int nBits, char nEvent, int nStop)
    {
        struct termios newtio,oldtio;
        if  ( tcgetattr( fd,&oldtio)  !=  0) {
            perror("SetupSerial 1");
            printf("tcgetattr( fd,&oldtio) -> %d\n",tcgetattr( fd,&oldtio));
            return -1;
        }
        bzero( &newtio, sizeof( newtio ) );
        newtio.c_cflag  |=  CLOCAL | CREAD;
        newtio.c_cflag &= ~CSIZE;
        switch( nBits )
        {
            case 7:
                newtio.c_cflag |= CS7;
                break;
            case 8:
                newtio.c_cflag |= CS8;
                break;
        }
        switch( nEvent )
        {
            case 'o':
            case 'O':
                newtio.c_cflag |= PARENB;
                newtio.c_cflag |= PARODD;
                newtio.c_iflag |= (INPCK | ISTRIP);
                break;
            case 'e':
            case 'E':
                newtio.c_iflag |= (INPCK | ISTRIP);
                newtio.c_cflag |= PARENB;
                newtio.c_cflag &= ~PARODD;
                break;
            case 'n':
            case 'N':
                newtio.c_cflag &= ~PARENB;
                break;
            default:
                break;
        }

        /*设置波特率*/

        switch( nSpeed )
        {
            case 2400:
                cfsetispeed(&newtio, B2400);
                cfsetospeed(&newtio, B2400);
                break;
            case 4800:
                cfsetispeed(&newtio, B4800);
                cfsetospeed(&newtio, B4800);
                break;
            case 9600:
                cfsetispeed(&newtio, B9600);
                cfsetospeed(&newtio, B9600);
                break;
            case 115200:
                cfsetispeed(&newtio, B115200);
                cfsetospeed(&newtio, B115200);
                break;
            case 460800:
                cfsetispeed(&newtio, B460800);
                cfsetospeed(&newtio, B460800);
                break;
            default:
                cfsetispeed(&newtio, B9600);
                cfsetospeed(&newtio, B9600);
                break;
        }
        if( nStop == 1 )
            newtio.c_cflag &=  ~CSTOPB;
        else if ( nStop == 2 )
            newtio.c_cflag |=  CSTOPB;
        newtio.c_cc[VTIME]  = 0;
        newtio.c_cc[VMIN] = 0;
        tcflush(fd,TCIFLUSH);

        if((tcsetattr(fd,TCSANOW,&newtio))!=0)
        {
            perror("com set error");
            return -1;
        }
        printf("set done!\n");
        return 0;
    }